

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O2

Ptr<Swapchain> __thiscall myvk::Swapchain::Create(Swapchain *this,Ptr<Swapchain> *old_swapchain)

{
  element_type *peVar1;
  undefined4 uVar2;
  PFN_vkCreateSwapchainKHR p_Var3;
  PFN_vkGetSwapchainImagesKHR p_Var4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  VkResult VVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkSwapchainCreateInfoKHR *pVVar10;
  VkSwapchainCreateInfoKHR *pVVar11;
  byte bVar12;
  Ptr<Swapchain> PVar13;
  shared_ptr<myvk::Swapchain> ret;
  int height;
  int width;
  VkSurfaceCapabilitiesKHR capabilities;
  
  bVar12 = 0;
  std::make_shared<myvk::Swapchain>();
  std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_graphics_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>,
             &(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->m_graphics_queue_ptr).
              super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>,
             &(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>);
  pVVar10 = &((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_swapchain_create_info;
  pVVar11 = &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_swapchain_create_info;
  for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar2 = *(undefined4 *)&pVVar10->field_0x4;
    pVVar11->sType = pVVar10->sType;
    *(undefined4 *)&pVVar11->field_0x4 = uVar2;
    pVVar10 = (VkSwapchainCreateInfoKHR *)((long)pVVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pVVar11 = (VkSwapchainCreateInfoKHR *)((long)pVVar11 + (ulong)bVar12 * -0x10 + 8);
  }
  iVar7 = (*(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
            (*(VkPhysicalDevice *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar7) + 0x18) + 0x28),
             (((((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_present_queue_ptr).
                super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_surface,&capabilities);
  if (capabilities.currentExtent.width == 0xffffffff) {
    glfwGetWindowSize((((((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_present_queue_ptr).
                         super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_surface_ptr).
                       super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      m_window,&width,&height);
    capabilities.currentExtent.width = capabilities.maxImageExtent.width;
    if ((uint)width < capabilities.maxImageExtent.width) {
      capabilities.currentExtent.width = width;
    }
    if (capabilities.currentExtent.width < capabilities.minImageExtent.width) {
      capabilities.currentExtent.width = capabilities.minImageExtent.width;
    }
    if ((uint)height < capabilities.maxImageExtent.height) {
      capabilities.maxImageExtent.height = height;
    }
    capabilities.currentExtent.height = capabilities.maxImageExtent.height;
    if (capabilities.maxImageExtent.height < capabilities.minImageExtent.height) {
      capabilities.currentExtent.height = capabilities.minImageExtent.height;
    }
  }
  peVar5 = ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_swapchain_create_info).sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  ((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_swapchain_create_info).imageExtent.width = capabilities.currentExtent.width;
  ((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_swapchain_create_info).imageExtent.height = capabilities.currentExtent.height;
  peVar1 = (old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ((ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_swapchain_create_info).oldSwapchain = peVar1->m_swapchain;
  p_Var3 = vkCreateSwapchainKHR;
  iVar7 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar8 = (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x268),
                    &peVar5->m_swapchain_create_info,(VkAllocationCallbacks *)0x0,
                    &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_swapchain);
  p_Var4 = vkGetSwapchainImagesKHR;
  if (VVar8 == VK_SUCCESS) {
    iVar7 = (*(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    (*p_Var4)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x268),
              (ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_swapchain,
              &(ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_image_count,(VkImage *)0x0);
    _Var6 = ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base =
         (_func_int **)ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var6._M_pi;
    ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar13.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar13.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Swapchain>)PVar13.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Swapchain> &old_swapchain) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = old_swapchain->m_graphics_queue_ptr;
	ret->m_present_queue_ptr = old_swapchain->m_present_queue_ptr;
	ret->m_swapchain_create_info = old_swapchain->m_swapchain_create_info;

	VkPhysicalDevice physical_device = old_swapchain->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, ret->m_present_queue_ptr->GetSurfacePtr()->GetHandle(),
	                                          &capabilities);

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(ret->m_present_queue_ptr->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// create swapchain
	VkSwapchainCreateInfoKHR &create_info = ret->m_swapchain_create_info;
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.imageExtent = extent;
	create_info.oldSwapchain = old_swapchain->GetHandle();

	if (vkCreateSwapchainKHR(old_swapchain->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(old_swapchain->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count, nullptr);

	return ret;
}